

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_stage10_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  uint uVar97;
  undefined4 uVar98;
  char in_DL;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in1_15;
  __m128i _in0_15;
  __m128i _in1_14;
  __m128i _in0_14;
  __m128i _in1_13;
  __m128i _in0_13;
  __m128i _in1_12;
  __m128i _in0_12;
  __m128i _in1_11;
  __m128i _in0_11;
  __m128i _in1_10;
  __m128i _in0_10;
  __m128i _in1_9;
  __m128i _in0_9;
  __m128i _in1_8;
  __m128i _in0_8;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  undefined2 local_1448;
  undefined2 uStack_1446;
  undefined2 uStack_1444;
  undefined2 uStack_1442;
  undefined2 local_1438;
  undefined2 uStack_1436;
  undefined2 uStack_1434;
  undefined2 uStack_1432;
  undefined2 local_1428;
  undefined2 uStack_1426;
  undefined2 uStack_1424;
  undefined2 uStack_1422;
  undefined2 local_1418;
  undefined2 uStack_1416;
  undefined2 uStack_1414;
  undefined2 uStack_1412;
  undefined2 local_1408;
  undefined2 uStack_1406;
  undefined2 uStack_1404;
  undefined2 uStack_1402;
  undefined2 local_13f8;
  undefined2 uStack_13f6;
  undefined2 uStack_13f4;
  undefined2 uStack_13f2;
  undefined2 local_13e8;
  undefined2 uStack_13e6;
  undefined2 uStack_13e4;
  undefined2 uStack_13e2;
  undefined2 local_13d8;
  undefined2 uStack_13d6;
  undefined2 uStack_13d4;
  undefined2 uStack_13d2;
  undefined2 local_13c8;
  undefined2 uStack_13c6;
  undefined2 uStack_13c4;
  undefined2 uStack_13c2;
  undefined2 local_13b8;
  undefined2 uStack_13b6;
  undefined2 uStack_13b4;
  undefined2 uStack_13b2;
  undefined2 local_13a8;
  undefined2 uStack_13a6;
  undefined2 uStack_13a4;
  undefined2 uStack_13a2;
  undefined2 local_1398;
  undefined2 uStack_1396;
  undefined2 uStack_1394;
  undefined2 uStack_1392;
  undefined2 local_1388;
  undefined2 uStack_1386;
  undefined2 uStack_1384;
  undefined2 uStack_1382;
  undefined2 local_1378;
  undefined2 uStack_1376;
  undefined2 uStack_1374;
  undefined2 uStack_1372;
  undefined2 local_1368;
  undefined2 uStack_1366;
  undefined2 uStack_1364;
  undefined2 uStack_1362;
  undefined2 local_1358;
  undefined2 uStack_1356;
  undefined2 uStack_1354;
  undefined2 uStack_1352;
  undefined2 uStack_1340;
  undefined2 uStack_133e;
  undefined2 uStack_133c;
  undefined2 uStack_133a;
  undefined2 uStack_1330;
  undefined2 uStack_132e;
  undefined2 uStack_132c;
  undefined2 uStack_132a;
  undefined2 uStack_1320;
  undefined2 uStack_131e;
  undefined2 uStack_131c;
  undefined2 uStack_131a;
  undefined2 uStack_1310;
  undefined2 uStack_130e;
  undefined2 uStack_130c;
  undefined2 uStack_130a;
  undefined2 uStack_1300;
  undefined2 uStack_12fe;
  undefined2 uStack_12fc;
  undefined2 uStack_12fa;
  undefined2 uStack_12f0;
  undefined2 uStack_12ee;
  undefined2 uStack_12ec;
  undefined2 uStack_12ea;
  undefined2 uStack_12e0;
  undefined2 uStack_12de;
  undefined2 uStack_12dc;
  undefined2 uStack_12da;
  undefined2 uStack_12d0;
  undefined2 uStack_12ce;
  undefined2 uStack_12cc;
  undefined2 uStack_12ca;
  undefined2 uStack_12c0;
  undefined2 uStack_12be;
  undefined2 uStack_12bc;
  undefined2 uStack_12ba;
  undefined2 uStack_12b0;
  undefined2 uStack_12ae;
  undefined2 uStack_12ac;
  undefined2 uStack_12aa;
  undefined2 uStack_12a0;
  undefined2 uStack_129e;
  undefined2 uStack_129c;
  undefined2 uStack_129a;
  undefined2 uStack_1290;
  undefined2 uStack_128e;
  undefined2 uStack_128c;
  undefined2 uStack_128a;
  undefined2 uStack_1280;
  undefined2 uStack_127e;
  undefined2 uStack_127c;
  undefined2 uStack_127a;
  undefined2 uStack_1270;
  undefined2 uStack_126e;
  undefined2 uStack_126c;
  undefined2 uStack_126a;
  undefined2 uStack_1260;
  undefined2 uStack_125e;
  undefined2 uStack_125c;
  undefined2 uStack_125a;
  undefined2 uStack_1250;
  undefined2 uStack_124e;
  undefined2 uStack_124c;
  undefined2 uStack_124a;
  int local_e38;
  int iStack_e34;
  int iStack_e30;
  int iStack_e2c;
  int local_e18;
  int iStack_e14;
  int iStack_e10;
  int iStack_e0c;
  int local_df8;
  int iStack_df4;
  int iStack_df0;
  int iStack_dec;
  int local_dd8;
  int iStack_dd4;
  int iStack_dd0;
  int iStack_dcc;
  int local_db8;
  int iStack_db4;
  int iStack_db0;
  int iStack_dac;
  int local_d98;
  int iStack_d94;
  int iStack_d90;
  int iStack_d8c;
  int local_d78;
  int iStack_d74;
  int iStack_d70;
  int iStack_d6c;
  int local_d58;
  int iStack_d54;
  int iStack_d50;
  int iStack_d4c;
  int local_d38;
  int iStack_d34;
  int iStack_d30;
  int iStack_d2c;
  int local_d18;
  int iStack_d14;
  int iStack_d10;
  int iStack_d0c;
  int local_cf8;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  int local_cd8;
  int iStack_cd4;
  int iStack_cd0;
  int iStack_ccc;
  int local_cb8;
  int iStack_cb4;
  int iStack_cb0;
  int iStack_cac;
  int local_c98;
  int iStack_c94;
  int iStack_c90;
  int iStack_c8c;
  int local_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  int local_c38;
  int iStack_c34;
  int iStack_c30;
  int iStack_c2c;
  int local_c18;
  int iStack_c14;
  int iStack_c10;
  int iStack_c0c;
  int local_bf8;
  int iStack_bf4;
  int iStack_bf0;
  int iStack_bec;
  int local_bd8;
  int iStack_bd4;
  int iStack_bd0;
  int iStack_bcc;
  int local_bb8;
  int iStack_bb4;
  int iStack_bb0;
  int iStack_bac;
  int local_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  int local_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int local_b58;
  int iStack_b54;
  int iStack_b50;
  int iStack_b4c;
  int local_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  int local_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int local_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int local_ad8;
  int iStack_ad4;
  int iStack_ad0;
  int iStack_acc;
  int local_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  int local_a98;
  int iStack_a94;
  int iStack_a90;
  int iStack_a8c;
  int local_a78;
  int iStack_a74;
  int iStack_a70;
  int iStack_a6c;
  int local_a68;
  int iStack_a64;
  int iStack_a60;
  int iStack_a5c;
  int local_a58;
  int iStack_a54;
  int iStack_a50;
  int iStack_a4c;
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  
  uVar97 = -*(int *)(in_RSI + 0x80) & 0xffffU | *(int *)(in_RSI + 0x80) << 0x10;
  uVar93 = CONCAT44(uVar97,uVar97);
  uVar94 = CONCAT44(uVar97,uVar97);
  uVar98 = CONCAT22(*(undefined2 *)(in_RSI + 0x80),*(undefined2 *)(in_RSI + 0x80));
  uVar95 = CONCAT44(uVar98,uVar98);
  uVar96 = CONCAT44(uVar98,uVar98);
  auVar100 = *in_RDI;
  auVar99 = paddsw(*in_RDI,in_RDI[0x1f]);
  *in_RDI = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x1f]);
  in_RDI[0x1f] = auVar100;
  auVar100 = in_RDI[1];
  auVar99 = paddsw(in_RDI[1],in_RDI[0x1e]);
  in_RDI[1] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x1e]);
  in_RDI[0x1e] = auVar100;
  auVar100 = in_RDI[2];
  auVar99 = paddsw(in_RDI[2],in_RDI[0x1d]);
  in_RDI[2] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x1d]);
  in_RDI[0x1d] = auVar100;
  auVar100 = in_RDI[3];
  auVar99 = paddsw(in_RDI[3],in_RDI[0x1c]);
  in_RDI[3] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x1c]);
  in_RDI[0x1c] = auVar100;
  auVar100 = in_RDI[4];
  auVar99 = paddsw(in_RDI[4],in_RDI[0x1b]);
  in_RDI[4] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x1b]);
  in_RDI[0x1b] = auVar100;
  auVar100 = in_RDI[5];
  auVar99 = paddsw(in_RDI[5],in_RDI[0x1a]);
  in_RDI[5] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x1a]);
  in_RDI[0x1a] = auVar100;
  auVar100 = in_RDI[6];
  auVar99 = paddsw(in_RDI[6],in_RDI[0x19]);
  in_RDI[6] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x19]);
  in_RDI[0x19] = auVar100;
  auVar100 = in_RDI[7];
  auVar99 = paddsw(in_RDI[7],in_RDI[0x18]);
  in_RDI[7] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x18]);
  in_RDI[0x18] = auVar100;
  auVar100 = in_RDI[8];
  auVar99 = paddsw(in_RDI[8],in_RDI[0x17]);
  in_RDI[8] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x17]);
  in_RDI[0x17] = auVar100;
  auVar100 = in_RDI[9];
  auVar99 = paddsw(in_RDI[9],in_RDI[0x16]);
  in_RDI[9] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x16]);
  in_RDI[0x16] = auVar100;
  auVar100 = in_RDI[10];
  auVar99 = paddsw(in_RDI[10],in_RDI[0x15]);
  in_RDI[10] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x15]);
  in_RDI[0x15] = auVar100;
  auVar100 = in_RDI[0xb];
  auVar99 = paddsw(in_RDI[0xb],in_RDI[0x14]);
  in_RDI[0xb] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x14]);
  in_RDI[0x14] = auVar100;
  auVar100 = in_RDI[0xc];
  auVar99 = paddsw(in_RDI[0xc],in_RDI[0x13]);
  in_RDI[0xc] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x13]);
  in_RDI[0x13] = auVar100;
  auVar100 = in_RDI[0xd];
  auVar99 = paddsw(in_RDI[0xd],in_RDI[0x12]);
  in_RDI[0xd] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x12]);
  in_RDI[0x12] = auVar100;
  auVar100 = in_RDI[0xe];
  auVar99 = paddsw(in_RDI[0xe],in_RDI[0x11]);
  in_RDI[0xe] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x11]);
  in_RDI[0x11] = auVar100;
  auVar100 = in_RDI[0xf];
  auVar99 = paddsw(in_RDI[0xf],in_RDI[0x10]);
  in_RDI[0xf] = auVar99;
  auVar100 = psubsw(auVar100,in_RDI[0x10]);
  in_RDI[0x10] = auVar100;
  uVar1 = *(undefined8 *)in_RDI[0x28];
  uVar2 = *(undefined8 *)in_RDI[0x37];
  local_1358 = (undefined2)uVar1;
  uStack_1356 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1354 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1352 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1368 = (undefined2)uVar2;
  uStack_1366 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1364 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1362 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x28] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x37] + 8);
  uStack_1250 = (undefined2)uVar1;
  uStack_124e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_124c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_124a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1260 = (undefined2)uVar2;
  uStack_125e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_125c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_125a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar60._2_2_ = local_1368;
  auVar60._0_2_ = local_1358;
  auVar60._4_2_ = uStack_1356;
  auVar60._6_2_ = uStack_1366;
  auVar60._10_2_ = uStack_1364;
  auVar60._8_2_ = uStack_1354;
  auVar60._12_2_ = uStack_1352;
  auVar60._14_2_ = uStack_1362;
  auVar59._8_8_ = uVar94;
  auVar59._0_8_ = uVar93;
  auVar100 = pmaddwd(auVar60,auVar59);
  auVar58._2_2_ = uStack_1260;
  auVar58._0_2_ = uStack_1250;
  auVar58._4_2_ = uStack_124e;
  auVar58._6_2_ = uStack_125e;
  auVar58._10_2_ = uStack_125c;
  auVar58._8_2_ = uStack_124c;
  auVar58._12_2_ = uStack_124a;
  auVar58._14_2_ = uStack_125a;
  auVar57._8_8_ = uVar94;
  auVar57._0_8_ = uVar93;
  auVar99 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = local_1368;
  auVar56._0_2_ = local_1358;
  auVar56._4_2_ = uStack_1356;
  auVar56._6_2_ = uStack_1366;
  auVar56._10_2_ = uStack_1364;
  auVar56._8_2_ = uStack_1354;
  auVar56._12_2_ = uStack_1352;
  auVar56._14_2_ = uStack_1362;
  auVar55._8_8_ = uVar96;
  auVar55._0_8_ = uVar95;
  auVar101 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_1260;
  auVar54._0_2_ = uStack_1250;
  auVar54._4_2_ = uStack_124e;
  auVar54._6_2_ = uStack_125e;
  auVar54._10_2_ = uStack_125c;
  auVar54._8_2_ = uStack_124c;
  auVar54._12_2_ = uStack_124a;
  auVar54._14_2_ = uStack_125a;
  auVar53._8_8_ = uVar96;
  auVar53._0_8_ = uVar95;
  auVar102 = pmaddwd(auVar54,auVar53);
  local_a58 = auVar100._0_4_;
  iStack_a54 = auVar100._4_4_;
  iStack_a50 = auVar100._8_4_;
  iStack_a4c = auVar100._12_4_;
  local_a68 = (int)in_XMM0_Qa;
  iStack_a64 = (int)((ulong)in_XMM0_Qa >> 0x20);
  iStack_a60 = (int)in_XMM0_Qb;
  iStack_a5c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_a78 = auVar99._0_4_;
  iStack_a74 = auVar99._4_4_;
  iStack_a70 = auVar99._8_4_;
  iStack_a6c = auVar99._12_4_;
  local_a98 = auVar101._0_4_;
  iStack_a94 = auVar101._4_4_;
  iStack_a90 = auVar101._8_4_;
  iStack_a8c = auVar101._12_4_;
  local_ab8 = auVar102._0_4_;
  iStack_ab4 = auVar102._4_4_;
  iStack_ab0 = auVar102._8_4_;
  iStack_aac = auVar102._12_4_;
  auVar100 = ZEXT416((uint)(int)in_DL);
  auVar99 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar92._4_4_ = iStack_a54 + iStack_a64 >> auVar100;
  auVar92._0_4_ = local_a58 + local_a68 >> auVar100;
  auVar92._12_4_ = iStack_a4c + iStack_a5c >> auVar100;
  auVar92._8_4_ = iStack_a50 + iStack_a60 >> auVar100;
  auVar91._4_4_ = iStack_a74 + iStack_a64 >> auVar99;
  auVar91._0_4_ = local_a78 + local_a68 >> auVar99;
  auVar91._12_4_ = iStack_a6c + iStack_a5c >> auVar99;
  auVar91._8_4_ = iStack_a70 + iStack_a60 >> auVar99;
  auVar100 = packssdw(auVar92,auVar91);
  in_RDI[0x28] = auVar100;
  auVar90._4_4_ = iStack_a94 + iStack_a64 >> auVar101;
  auVar90._0_4_ = local_a98 + local_a68 >> auVar101;
  auVar90._12_4_ = iStack_a8c + iStack_a5c >> auVar101;
  auVar90._8_4_ = iStack_a90 + iStack_a60 >> auVar101;
  auVar89._4_4_ = iStack_ab4 + iStack_a64 >> auVar102;
  auVar89._0_4_ = local_ab8 + local_a68 >> auVar102;
  auVar89._12_4_ = iStack_aac + iStack_a5c >> auVar102;
  auVar89._8_4_ = iStack_ab0 + iStack_a60 >> auVar102;
  auVar100 = packssdw(auVar90,auVar89);
  in_RDI[0x37] = auVar100;
  uVar1 = *(undefined8 *)in_RDI[0x29];
  uVar2 = *(undefined8 *)in_RDI[0x36];
  local_1378 = (undefined2)uVar1;
  uStack_1376 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1374 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1372 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1388 = (undefined2)uVar2;
  uStack_1386 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1384 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1382 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x29] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x36] + 8);
  uStack_1270 = (undefined2)uVar1;
  uStack_126e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_126c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_126a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1280 = (undefined2)uVar2;
  uStack_127e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_127c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_127a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar52._2_2_ = local_1388;
  auVar52._0_2_ = local_1378;
  auVar52._4_2_ = uStack_1376;
  auVar52._6_2_ = uStack_1386;
  auVar52._10_2_ = uStack_1384;
  auVar52._8_2_ = uStack_1374;
  auVar52._12_2_ = uStack_1372;
  auVar52._14_2_ = uStack_1382;
  auVar51._8_8_ = uVar94;
  auVar51._0_8_ = uVar93;
  auVar100 = pmaddwd(auVar52,auVar51);
  auVar50._2_2_ = uStack_1280;
  auVar50._0_2_ = uStack_1270;
  auVar50._4_2_ = uStack_126e;
  auVar50._6_2_ = uStack_127e;
  auVar50._10_2_ = uStack_127c;
  auVar50._8_2_ = uStack_126c;
  auVar50._12_2_ = uStack_126a;
  auVar50._14_2_ = uStack_127a;
  auVar49._8_8_ = uVar94;
  auVar49._0_8_ = uVar93;
  auVar99 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = local_1388;
  auVar48._0_2_ = local_1378;
  auVar48._4_2_ = uStack_1376;
  auVar48._6_2_ = uStack_1386;
  auVar48._10_2_ = uStack_1384;
  auVar48._8_2_ = uStack_1374;
  auVar48._12_2_ = uStack_1372;
  auVar48._14_2_ = uStack_1382;
  auVar47._8_8_ = uVar96;
  auVar47._0_8_ = uVar95;
  auVar101 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = uStack_1280;
  auVar46._0_2_ = uStack_1270;
  auVar46._4_2_ = uStack_126e;
  auVar46._6_2_ = uStack_127e;
  auVar46._10_2_ = uStack_127c;
  auVar46._8_2_ = uStack_126c;
  auVar46._12_2_ = uStack_126a;
  auVar46._14_2_ = uStack_127a;
  auVar45._8_8_ = uVar96;
  auVar45._0_8_ = uVar95;
  auVar102 = pmaddwd(auVar46,auVar45);
  local_ad8 = auVar100._0_4_;
  iStack_ad4 = auVar100._4_4_;
  iStack_ad0 = auVar100._8_4_;
  iStack_acc = auVar100._12_4_;
  local_af8 = auVar99._0_4_;
  iStack_af4 = auVar99._4_4_;
  iStack_af0 = auVar99._8_4_;
  iStack_aec = auVar99._12_4_;
  local_b18 = auVar101._0_4_;
  iStack_b14 = auVar101._4_4_;
  iStack_b10 = auVar101._8_4_;
  iStack_b0c = auVar101._12_4_;
  local_b38 = auVar102._0_4_;
  iStack_b34 = auVar102._4_4_;
  iStack_b30 = auVar102._8_4_;
  iStack_b2c = auVar102._12_4_;
  auVar100 = ZEXT416((uint)(int)in_DL);
  auVar99 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar88._4_4_ = iStack_ad4 + iStack_a64 >> auVar100;
  auVar88._0_4_ = local_ad8 + local_a68 >> auVar100;
  auVar88._12_4_ = iStack_acc + iStack_a5c >> auVar100;
  auVar88._8_4_ = iStack_ad0 + iStack_a60 >> auVar100;
  auVar87._4_4_ = iStack_af4 + iStack_a64 >> auVar99;
  auVar87._0_4_ = local_af8 + local_a68 >> auVar99;
  auVar87._12_4_ = iStack_aec + iStack_a5c >> auVar99;
  auVar87._8_4_ = iStack_af0 + iStack_a60 >> auVar99;
  auVar100 = packssdw(auVar88,auVar87);
  in_RDI[0x29] = auVar100;
  auVar86._4_4_ = iStack_b14 + iStack_a64 >> auVar101;
  auVar86._0_4_ = local_b18 + local_a68 >> auVar101;
  auVar86._12_4_ = iStack_b0c + iStack_a5c >> auVar101;
  auVar86._8_4_ = iStack_b10 + iStack_a60 >> auVar101;
  auVar85._4_4_ = iStack_b34 + iStack_a64 >> auVar102;
  auVar85._0_4_ = local_b38 + local_a68 >> auVar102;
  auVar85._12_4_ = iStack_b2c + iStack_a5c >> auVar102;
  auVar85._8_4_ = iStack_b30 + iStack_a60 >> auVar102;
  auVar100 = packssdw(auVar86,auVar85);
  in_RDI[0x36] = auVar100;
  uVar1 = *(undefined8 *)in_RDI[0x2a];
  uVar2 = *(undefined8 *)in_RDI[0x35];
  local_1398 = (undefined2)uVar1;
  uStack_1396 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1394 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1392 = (undefined2)((ulong)uVar1 >> 0x30);
  local_13a8 = (undefined2)uVar2;
  uStack_13a6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_13a4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_13a2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x2a] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x35] + 8);
  uStack_1290 = (undefined2)uVar1;
  uStack_128e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_128c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_128a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_12a0 = (undefined2)uVar2;
  uStack_129e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_129c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_129a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar44._2_2_ = local_13a8;
  auVar44._0_2_ = local_1398;
  auVar44._4_2_ = uStack_1396;
  auVar44._6_2_ = uStack_13a6;
  auVar44._10_2_ = uStack_13a4;
  auVar44._8_2_ = uStack_1394;
  auVar44._12_2_ = uStack_1392;
  auVar44._14_2_ = uStack_13a2;
  auVar43._8_8_ = uVar94;
  auVar43._0_8_ = uVar93;
  auVar100 = pmaddwd(auVar44,auVar43);
  auVar42._2_2_ = uStack_12a0;
  auVar42._0_2_ = uStack_1290;
  auVar42._4_2_ = uStack_128e;
  auVar42._6_2_ = uStack_129e;
  auVar42._10_2_ = uStack_129c;
  auVar42._8_2_ = uStack_128c;
  auVar42._12_2_ = uStack_128a;
  auVar42._14_2_ = uStack_129a;
  auVar41._8_8_ = uVar94;
  auVar41._0_8_ = uVar93;
  auVar99 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = local_13a8;
  auVar40._0_2_ = local_1398;
  auVar40._4_2_ = uStack_1396;
  auVar40._6_2_ = uStack_13a6;
  auVar40._10_2_ = uStack_13a4;
  auVar40._8_2_ = uStack_1394;
  auVar40._12_2_ = uStack_1392;
  auVar40._14_2_ = uStack_13a2;
  auVar39._8_8_ = uVar96;
  auVar39._0_8_ = uVar95;
  auVar101 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = uStack_12a0;
  auVar38._0_2_ = uStack_1290;
  auVar38._4_2_ = uStack_128e;
  auVar38._6_2_ = uStack_129e;
  auVar38._10_2_ = uStack_129c;
  auVar38._8_2_ = uStack_128c;
  auVar38._12_2_ = uStack_128a;
  auVar38._14_2_ = uStack_129a;
  auVar37._8_8_ = uVar96;
  auVar37._0_8_ = uVar95;
  auVar102 = pmaddwd(auVar38,auVar37);
  local_b58 = auVar100._0_4_;
  iStack_b54 = auVar100._4_4_;
  iStack_b50 = auVar100._8_4_;
  iStack_b4c = auVar100._12_4_;
  local_b78 = auVar99._0_4_;
  iStack_b74 = auVar99._4_4_;
  iStack_b70 = auVar99._8_4_;
  iStack_b6c = auVar99._12_4_;
  local_b98 = auVar101._0_4_;
  iStack_b94 = auVar101._4_4_;
  iStack_b90 = auVar101._8_4_;
  iStack_b8c = auVar101._12_4_;
  local_bb8 = auVar102._0_4_;
  iStack_bb4 = auVar102._4_4_;
  iStack_bb0 = auVar102._8_4_;
  iStack_bac = auVar102._12_4_;
  auVar100 = ZEXT416((uint)(int)in_DL);
  auVar99 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar84._4_4_ = iStack_b54 + iStack_a64 >> auVar100;
  auVar84._0_4_ = local_b58 + local_a68 >> auVar100;
  auVar84._12_4_ = iStack_b4c + iStack_a5c >> auVar100;
  auVar84._8_4_ = iStack_b50 + iStack_a60 >> auVar100;
  auVar83._4_4_ = iStack_b74 + iStack_a64 >> auVar99;
  auVar83._0_4_ = local_b78 + local_a68 >> auVar99;
  auVar83._12_4_ = iStack_b6c + iStack_a5c >> auVar99;
  auVar83._8_4_ = iStack_b70 + iStack_a60 >> auVar99;
  auVar100 = packssdw(auVar84,auVar83);
  in_RDI[0x2a] = auVar100;
  auVar82._4_4_ = iStack_b94 + iStack_a64 >> auVar101;
  auVar82._0_4_ = local_b98 + local_a68 >> auVar101;
  auVar82._12_4_ = iStack_b8c + iStack_a5c >> auVar101;
  auVar82._8_4_ = iStack_b90 + iStack_a60 >> auVar101;
  auVar81._4_4_ = iStack_bb4 + iStack_a64 >> auVar102;
  auVar81._0_4_ = local_bb8 + local_a68 >> auVar102;
  auVar81._12_4_ = iStack_bac + iStack_a5c >> auVar102;
  auVar81._8_4_ = iStack_bb0 + iStack_a60 >> auVar102;
  auVar100 = packssdw(auVar82,auVar81);
  in_RDI[0x35] = auVar100;
  uVar1 = *(undefined8 *)in_RDI[0x2b];
  uVar2 = *(undefined8 *)in_RDI[0x34];
  local_13b8 = (undefined2)uVar1;
  uStack_13b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_13b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_13b2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_13c8 = (undefined2)uVar2;
  uStack_13c6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_13c4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_13c2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x2b] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x34] + 8);
  uStack_12b0 = (undefined2)uVar1;
  uStack_12ae = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_12ac = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_12aa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_12c0 = (undefined2)uVar2;
  uStack_12be = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_12bc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_12ba = (undefined2)((ulong)uVar2 >> 0x30);
  auVar36._2_2_ = local_13c8;
  auVar36._0_2_ = local_13b8;
  auVar36._4_2_ = uStack_13b6;
  auVar36._6_2_ = uStack_13c6;
  auVar36._10_2_ = uStack_13c4;
  auVar36._8_2_ = uStack_13b4;
  auVar36._12_2_ = uStack_13b2;
  auVar36._14_2_ = uStack_13c2;
  auVar35._8_8_ = uVar94;
  auVar35._0_8_ = uVar93;
  auVar100 = pmaddwd(auVar36,auVar35);
  auVar34._2_2_ = uStack_12c0;
  auVar34._0_2_ = uStack_12b0;
  auVar34._4_2_ = uStack_12ae;
  auVar34._6_2_ = uStack_12be;
  auVar34._10_2_ = uStack_12bc;
  auVar34._8_2_ = uStack_12ac;
  auVar34._12_2_ = uStack_12aa;
  auVar34._14_2_ = uStack_12ba;
  auVar33._8_8_ = uVar94;
  auVar33._0_8_ = uVar93;
  auVar99 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = local_13c8;
  auVar32._0_2_ = local_13b8;
  auVar32._4_2_ = uStack_13b6;
  auVar32._6_2_ = uStack_13c6;
  auVar32._10_2_ = uStack_13c4;
  auVar32._8_2_ = uStack_13b4;
  auVar32._12_2_ = uStack_13b2;
  auVar32._14_2_ = uStack_13c2;
  auVar31._8_8_ = uVar96;
  auVar31._0_8_ = uVar95;
  auVar101 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = uStack_12c0;
  auVar30._0_2_ = uStack_12b0;
  auVar30._4_2_ = uStack_12ae;
  auVar30._6_2_ = uStack_12be;
  auVar30._10_2_ = uStack_12bc;
  auVar30._8_2_ = uStack_12ac;
  auVar30._12_2_ = uStack_12aa;
  auVar30._14_2_ = uStack_12ba;
  auVar29._8_8_ = uVar96;
  auVar29._0_8_ = uVar95;
  auVar102 = pmaddwd(auVar30,auVar29);
  local_bd8 = auVar100._0_4_;
  iStack_bd4 = auVar100._4_4_;
  iStack_bd0 = auVar100._8_4_;
  iStack_bcc = auVar100._12_4_;
  local_bf8 = auVar99._0_4_;
  iStack_bf4 = auVar99._4_4_;
  iStack_bf0 = auVar99._8_4_;
  iStack_bec = auVar99._12_4_;
  local_c18 = auVar101._0_4_;
  iStack_c14 = auVar101._4_4_;
  iStack_c10 = auVar101._8_4_;
  iStack_c0c = auVar101._12_4_;
  local_c38 = auVar102._0_4_;
  iStack_c34 = auVar102._4_4_;
  iStack_c30 = auVar102._8_4_;
  iStack_c2c = auVar102._12_4_;
  auVar100 = ZEXT416((uint)(int)in_DL);
  auVar99 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar80._4_4_ = iStack_bd4 + iStack_a64 >> auVar100;
  auVar80._0_4_ = local_bd8 + local_a68 >> auVar100;
  auVar80._12_4_ = iStack_bcc + iStack_a5c >> auVar100;
  auVar80._8_4_ = iStack_bd0 + iStack_a60 >> auVar100;
  auVar79._4_4_ = iStack_bf4 + iStack_a64 >> auVar99;
  auVar79._0_4_ = local_bf8 + local_a68 >> auVar99;
  auVar79._12_4_ = iStack_bec + iStack_a5c >> auVar99;
  auVar79._8_4_ = iStack_bf0 + iStack_a60 >> auVar99;
  auVar100 = packssdw(auVar80,auVar79);
  in_RDI[0x2b] = auVar100;
  auVar78._4_4_ = iStack_c14 + iStack_a64 >> auVar101;
  auVar78._0_4_ = local_c18 + local_a68 >> auVar101;
  auVar78._12_4_ = iStack_c0c + iStack_a5c >> auVar101;
  auVar78._8_4_ = iStack_c10 + iStack_a60 >> auVar101;
  auVar77._4_4_ = iStack_c34 + iStack_a64 >> auVar102;
  auVar77._0_4_ = local_c38 + local_a68 >> auVar102;
  auVar77._12_4_ = iStack_c2c + iStack_a5c >> auVar102;
  auVar77._8_4_ = iStack_c30 + iStack_a60 >> auVar102;
  auVar100 = packssdw(auVar78,auVar77);
  in_RDI[0x34] = auVar100;
  uVar1 = *(undefined8 *)in_RDI[0x2c];
  uVar2 = *(undefined8 *)in_RDI[0x33];
  local_13d8 = (undefined2)uVar1;
  uStack_13d6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_13d4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_13d2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_13e8 = (undefined2)uVar2;
  uStack_13e6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_13e4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_13e2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x2c] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x33] + 8);
  uStack_12d0 = (undefined2)uVar1;
  uStack_12ce = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_12cc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_12ca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_12e0 = (undefined2)uVar2;
  uStack_12de = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_12dc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_12da = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_13e8;
  auVar28._0_2_ = local_13d8;
  auVar28._4_2_ = uStack_13d6;
  auVar28._6_2_ = uStack_13e6;
  auVar28._10_2_ = uStack_13e4;
  auVar28._8_2_ = uStack_13d4;
  auVar28._12_2_ = uStack_13d2;
  auVar28._14_2_ = uStack_13e2;
  auVar27._8_8_ = uVar94;
  auVar27._0_8_ = uVar93;
  auVar100 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_12e0;
  auVar26._0_2_ = uStack_12d0;
  auVar26._4_2_ = uStack_12ce;
  auVar26._6_2_ = uStack_12de;
  auVar26._10_2_ = uStack_12dc;
  auVar26._8_2_ = uStack_12cc;
  auVar26._12_2_ = uStack_12ca;
  auVar26._14_2_ = uStack_12da;
  auVar25._8_8_ = uVar94;
  auVar25._0_8_ = uVar93;
  auVar99 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_13e8;
  auVar24._0_2_ = local_13d8;
  auVar24._4_2_ = uStack_13d6;
  auVar24._6_2_ = uStack_13e6;
  auVar24._10_2_ = uStack_13e4;
  auVar24._8_2_ = uStack_13d4;
  auVar24._12_2_ = uStack_13d2;
  auVar24._14_2_ = uStack_13e2;
  auVar23._8_8_ = uVar96;
  auVar23._0_8_ = uVar95;
  auVar101 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_12e0;
  auVar22._0_2_ = uStack_12d0;
  auVar22._4_2_ = uStack_12ce;
  auVar22._6_2_ = uStack_12de;
  auVar22._10_2_ = uStack_12dc;
  auVar22._8_2_ = uStack_12cc;
  auVar22._12_2_ = uStack_12ca;
  auVar22._14_2_ = uStack_12da;
  auVar21._8_8_ = uVar96;
  auVar21._0_8_ = uVar95;
  auVar102 = pmaddwd(auVar22,auVar21);
  local_c58 = auVar100._0_4_;
  iStack_c54 = auVar100._4_4_;
  iStack_c50 = auVar100._8_4_;
  iStack_c4c = auVar100._12_4_;
  local_c78 = auVar99._0_4_;
  iStack_c74 = auVar99._4_4_;
  iStack_c70 = auVar99._8_4_;
  iStack_c6c = auVar99._12_4_;
  local_c98 = auVar101._0_4_;
  iStack_c94 = auVar101._4_4_;
  iStack_c90 = auVar101._8_4_;
  iStack_c8c = auVar101._12_4_;
  local_cb8 = auVar102._0_4_;
  iStack_cb4 = auVar102._4_4_;
  iStack_cb0 = auVar102._8_4_;
  iStack_cac = auVar102._12_4_;
  auVar100 = ZEXT416((uint)(int)in_DL);
  auVar99 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar76._4_4_ = iStack_c54 + iStack_a64 >> auVar100;
  auVar76._0_4_ = local_c58 + local_a68 >> auVar100;
  auVar76._12_4_ = iStack_c4c + iStack_a5c >> auVar100;
  auVar76._8_4_ = iStack_c50 + iStack_a60 >> auVar100;
  auVar75._4_4_ = iStack_c74 + iStack_a64 >> auVar99;
  auVar75._0_4_ = local_c78 + local_a68 >> auVar99;
  auVar75._12_4_ = iStack_c6c + iStack_a5c >> auVar99;
  auVar75._8_4_ = iStack_c70 + iStack_a60 >> auVar99;
  auVar100 = packssdw(auVar76,auVar75);
  in_RDI[0x2c] = auVar100;
  auVar74._4_4_ = iStack_c94 + iStack_a64 >> auVar101;
  auVar74._0_4_ = local_c98 + local_a68 >> auVar101;
  auVar74._12_4_ = iStack_c8c + iStack_a5c >> auVar101;
  auVar74._8_4_ = iStack_c90 + iStack_a60 >> auVar101;
  auVar73._4_4_ = iStack_cb4 + iStack_a64 >> auVar102;
  auVar73._0_4_ = local_cb8 + local_a68 >> auVar102;
  auVar73._12_4_ = iStack_cac + iStack_a5c >> auVar102;
  auVar73._8_4_ = iStack_cb0 + iStack_a60 >> auVar102;
  auVar100 = packssdw(auVar74,auVar73);
  in_RDI[0x33] = auVar100;
  uVar1 = *(undefined8 *)in_RDI[0x2d];
  uVar2 = *(undefined8 *)in_RDI[0x32];
  local_13f8 = (undefined2)uVar1;
  uStack_13f6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_13f4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_13f2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1408 = (undefined2)uVar2;
  uStack_1406 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1404 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1402 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x2d] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x32] + 8);
  uStack_12f0 = (undefined2)uVar1;
  uStack_12ee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_12ec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_12ea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1300 = (undefined2)uVar2;
  uStack_12fe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_12fc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_12fa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_1408;
  auVar20._0_2_ = local_13f8;
  auVar20._4_2_ = uStack_13f6;
  auVar20._6_2_ = uStack_1406;
  auVar20._10_2_ = uStack_1404;
  auVar20._8_2_ = uStack_13f4;
  auVar20._12_2_ = uStack_13f2;
  auVar20._14_2_ = uStack_1402;
  auVar19._8_8_ = uVar94;
  auVar19._0_8_ = uVar93;
  auVar100 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_1300;
  auVar18._0_2_ = uStack_12f0;
  auVar18._4_2_ = uStack_12ee;
  auVar18._6_2_ = uStack_12fe;
  auVar18._10_2_ = uStack_12fc;
  auVar18._8_2_ = uStack_12ec;
  auVar18._12_2_ = uStack_12ea;
  auVar18._14_2_ = uStack_12fa;
  auVar17._8_8_ = uVar94;
  auVar17._0_8_ = uVar93;
  auVar99 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_1408;
  auVar16._0_2_ = local_13f8;
  auVar16._4_2_ = uStack_13f6;
  auVar16._6_2_ = uStack_1406;
  auVar16._10_2_ = uStack_1404;
  auVar16._8_2_ = uStack_13f4;
  auVar16._12_2_ = uStack_13f2;
  auVar16._14_2_ = uStack_1402;
  auVar15._8_8_ = uVar96;
  auVar15._0_8_ = uVar95;
  auVar101 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_1300;
  auVar14._0_2_ = uStack_12f0;
  auVar14._4_2_ = uStack_12ee;
  auVar14._6_2_ = uStack_12fe;
  auVar14._10_2_ = uStack_12fc;
  auVar14._8_2_ = uStack_12ec;
  auVar14._12_2_ = uStack_12ea;
  auVar14._14_2_ = uStack_12fa;
  auVar13._8_8_ = uVar96;
  auVar13._0_8_ = uVar95;
  auVar102 = pmaddwd(auVar14,auVar13);
  local_cd8 = auVar100._0_4_;
  iStack_cd4 = auVar100._4_4_;
  iStack_cd0 = auVar100._8_4_;
  iStack_ccc = auVar100._12_4_;
  local_cf8 = auVar99._0_4_;
  iStack_cf4 = auVar99._4_4_;
  iStack_cf0 = auVar99._8_4_;
  iStack_cec = auVar99._12_4_;
  local_d18 = auVar101._0_4_;
  iStack_d14 = auVar101._4_4_;
  iStack_d10 = auVar101._8_4_;
  iStack_d0c = auVar101._12_4_;
  local_d38 = auVar102._0_4_;
  iStack_d34 = auVar102._4_4_;
  iStack_d30 = auVar102._8_4_;
  iStack_d2c = auVar102._12_4_;
  auVar100 = ZEXT416((uint)(int)in_DL);
  auVar99 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar72._4_4_ = iStack_cd4 + iStack_a64 >> auVar100;
  auVar72._0_4_ = local_cd8 + local_a68 >> auVar100;
  auVar72._12_4_ = iStack_ccc + iStack_a5c >> auVar100;
  auVar72._8_4_ = iStack_cd0 + iStack_a60 >> auVar100;
  auVar71._4_4_ = iStack_cf4 + iStack_a64 >> auVar99;
  auVar71._0_4_ = local_cf8 + local_a68 >> auVar99;
  auVar71._12_4_ = iStack_cec + iStack_a5c >> auVar99;
  auVar71._8_4_ = iStack_cf0 + iStack_a60 >> auVar99;
  auVar100 = packssdw(auVar72,auVar71);
  in_RDI[0x2d] = auVar100;
  auVar70._4_4_ = iStack_d14 + iStack_a64 >> auVar101;
  auVar70._0_4_ = local_d18 + local_a68 >> auVar101;
  auVar70._12_4_ = iStack_d0c + iStack_a5c >> auVar101;
  auVar70._8_4_ = iStack_d10 + iStack_a60 >> auVar101;
  auVar69._4_4_ = iStack_d34 + iStack_a64 >> auVar102;
  auVar69._0_4_ = local_d38 + local_a68 >> auVar102;
  auVar69._12_4_ = iStack_d2c + iStack_a5c >> auVar102;
  auVar69._8_4_ = iStack_d30 + iStack_a60 >> auVar102;
  auVar100 = packssdw(auVar70,auVar69);
  in_RDI[0x32] = auVar100;
  uVar1 = *(undefined8 *)in_RDI[0x2e];
  uVar2 = *(undefined8 *)in_RDI[0x31];
  local_1418 = (undefined2)uVar1;
  uStack_1416 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1414 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1412 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1428 = (undefined2)uVar2;
  uStack_1426 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1424 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1422 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x2e] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x31] + 8);
  uStack_1310 = (undefined2)uVar1;
  uStack_130e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_130c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_130a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1320 = (undefined2)uVar2;
  uStack_131e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_131c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_131a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_1428;
  auVar12._0_2_ = local_1418;
  auVar12._4_2_ = uStack_1416;
  auVar12._6_2_ = uStack_1426;
  auVar12._10_2_ = uStack_1424;
  auVar12._8_2_ = uStack_1414;
  auVar12._12_2_ = uStack_1412;
  auVar12._14_2_ = uStack_1422;
  auVar11._8_8_ = uVar94;
  auVar11._0_8_ = uVar93;
  auVar100 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_1320;
  auVar10._0_2_ = uStack_1310;
  auVar10._4_2_ = uStack_130e;
  auVar10._6_2_ = uStack_131e;
  auVar10._10_2_ = uStack_131c;
  auVar10._8_2_ = uStack_130c;
  auVar10._12_2_ = uStack_130a;
  auVar10._14_2_ = uStack_131a;
  auVar9._8_8_ = uVar94;
  auVar9._0_8_ = uVar93;
  auVar99 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_1428;
  auVar8._0_2_ = local_1418;
  auVar8._4_2_ = uStack_1416;
  auVar8._6_2_ = uStack_1426;
  auVar8._10_2_ = uStack_1424;
  auVar8._8_2_ = uStack_1414;
  auVar8._12_2_ = uStack_1412;
  auVar8._14_2_ = uStack_1422;
  auVar7._8_8_ = uVar96;
  auVar7._0_8_ = uVar95;
  auVar101 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_1320;
  auVar6._0_2_ = uStack_1310;
  auVar6._4_2_ = uStack_130e;
  auVar6._6_2_ = uStack_131e;
  auVar6._10_2_ = uStack_131c;
  auVar6._8_2_ = uStack_130c;
  auVar6._12_2_ = uStack_130a;
  auVar6._14_2_ = uStack_131a;
  auVar5._8_8_ = uVar96;
  auVar5._0_8_ = uVar95;
  auVar102 = pmaddwd(auVar6,auVar5);
  local_d58 = auVar100._0_4_;
  iStack_d54 = auVar100._4_4_;
  iStack_d50 = auVar100._8_4_;
  iStack_d4c = auVar100._12_4_;
  local_d78 = auVar99._0_4_;
  iStack_d74 = auVar99._4_4_;
  iStack_d70 = auVar99._8_4_;
  iStack_d6c = auVar99._12_4_;
  local_d98 = auVar101._0_4_;
  iStack_d94 = auVar101._4_4_;
  iStack_d90 = auVar101._8_4_;
  iStack_d8c = auVar101._12_4_;
  local_db8 = auVar102._0_4_;
  iStack_db4 = auVar102._4_4_;
  iStack_db0 = auVar102._8_4_;
  iStack_dac = auVar102._12_4_;
  auVar100 = ZEXT416((uint)(int)in_DL);
  auVar99 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar68._4_4_ = iStack_d54 + iStack_a64 >> auVar100;
  auVar68._0_4_ = local_d58 + local_a68 >> auVar100;
  auVar68._12_4_ = iStack_d4c + iStack_a5c >> auVar100;
  auVar68._8_4_ = iStack_d50 + iStack_a60 >> auVar100;
  auVar67._4_4_ = iStack_d74 + iStack_a64 >> auVar99;
  auVar67._0_4_ = local_d78 + local_a68 >> auVar99;
  auVar67._12_4_ = iStack_d6c + iStack_a5c >> auVar99;
  auVar67._8_4_ = iStack_d70 + iStack_a60 >> auVar99;
  auVar100 = packssdw(auVar68,auVar67);
  in_RDI[0x2e] = auVar100;
  auVar66._4_4_ = iStack_d94 + iStack_a64 >> auVar101;
  auVar66._0_4_ = local_d98 + local_a68 >> auVar101;
  auVar66._12_4_ = iStack_d8c + iStack_a5c >> auVar101;
  auVar66._8_4_ = iStack_d90 + iStack_a60 >> auVar101;
  auVar65._4_4_ = iStack_db4 + iStack_a64 >> auVar102;
  auVar65._0_4_ = local_db8 + local_a68 >> auVar102;
  auVar65._12_4_ = iStack_dac + iStack_a5c >> auVar102;
  auVar65._8_4_ = iStack_db0 + iStack_a60 >> auVar102;
  auVar100 = packssdw(auVar66,auVar65);
  in_RDI[0x31] = auVar100;
  uVar1 = *(undefined8 *)in_RDI[0x2f];
  uVar2 = *(undefined8 *)in_RDI[0x30];
  local_1438 = (undefined2)uVar1;
  uStack_1436 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1434 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1432 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1448 = (undefined2)uVar2;
  uStack_1446 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1444 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1442 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x2f] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x30] + 8);
  uStack_1330 = (undefined2)uVar1;
  uStack_132e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_132c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_132a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1340 = (undefined2)uVar2;
  uStack_133e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_133c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_133a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_1448;
  auVar4._0_2_ = local_1438;
  auVar4._4_2_ = uStack_1436;
  auVar4._6_2_ = uStack_1446;
  auVar4._10_2_ = uStack_1444;
  auVar4._8_2_ = uStack_1434;
  auVar4._12_2_ = uStack_1432;
  auVar4._14_2_ = uStack_1442;
  auVar103._8_8_ = uVar94;
  auVar103._0_8_ = uVar93;
  auVar103 = pmaddwd(auVar4,auVar103);
  auVar3._2_2_ = uStack_1340;
  auVar3._0_2_ = uStack_1330;
  auVar3._4_2_ = uStack_132e;
  auVar3._6_2_ = uStack_133e;
  auVar3._10_2_ = uStack_133c;
  auVar3._8_2_ = uStack_132c;
  auVar3._12_2_ = uStack_132a;
  auVar3._14_2_ = uStack_133a;
  auVar104._8_8_ = uVar94;
  auVar104._0_8_ = uVar93;
  auVar104 = pmaddwd(auVar3,auVar104);
  auVar102._2_2_ = local_1448;
  auVar102._0_2_ = local_1438;
  auVar102._4_2_ = uStack_1436;
  auVar102._6_2_ = uStack_1446;
  auVar102._10_2_ = uStack_1444;
  auVar102._8_2_ = uStack_1434;
  auVar102._12_2_ = uStack_1432;
  auVar102._14_2_ = uStack_1442;
  auVar101._8_8_ = uVar96;
  auVar101._0_8_ = uVar95;
  auVar101 = pmaddwd(auVar102,auVar101);
  auVar99._2_2_ = uStack_1340;
  auVar99._0_2_ = uStack_1330;
  auVar99._4_2_ = uStack_132e;
  auVar99._6_2_ = uStack_133e;
  auVar99._10_2_ = uStack_133c;
  auVar99._8_2_ = uStack_132c;
  auVar99._12_2_ = uStack_132a;
  auVar99._14_2_ = uStack_133a;
  auVar100._8_8_ = uVar96;
  auVar100._0_8_ = uVar95;
  auVar100 = pmaddwd(auVar99,auVar100);
  local_dd8 = auVar103._0_4_;
  iStack_dd4 = auVar103._4_4_;
  iStack_dd0 = auVar103._8_4_;
  iStack_dcc = auVar103._12_4_;
  local_df8 = auVar104._0_4_;
  iStack_df4 = auVar104._4_4_;
  iStack_df0 = auVar104._8_4_;
  iStack_dec = auVar104._12_4_;
  local_e18 = auVar101._0_4_;
  iStack_e14 = auVar101._4_4_;
  iStack_e10 = auVar101._8_4_;
  iStack_e0c = auVar101._12_4_;
  local_e38 = auVar100._0_4_;
  iStack_e34 = auVar100._4_4_;
  iStack_e30 = auVar100._8_4_;
  iStack_e2c = auVar100._12_4_;
  auVar100 = ZEXT416((uint)(int)in_DL);
  auVar99 = ZEXT416((uint)(int)in_DL);
  auVar101 = ZEXT416((uint)(int)in_DL);
  auVar102 = ZEXT416((uint)(int)in_DL);
  auVar64._4_4_ = iStack_dd4 + iStack_a64 >> auVar100;
  auVar64._0_4_ = local_dd8 + local_a68 >> auVar100;
  auVar64._12_4_ = iStack_dcc + iStack_a5c >> auVar100;
  auVar64._8_4_ = iStack_dd0 + iStack_a60 >> auVar100;
  auVar63._4_4_ = iStack_df4 + iStack_a64 >> auVar99;
  auVar63._0_4_ = local_df8 + local_a68 >> auVar99;
  auVar63._12_4_ = iStack_dec + iStack_a5c >> auVar99;
  auVar63._8_4_ = iStack_df0 + iStack_a60 >> auVar99;
  auVar100 = packssdw(auVar64,auVar63);
  in_RDI[0x2f] = auVar100;
  auVar62._4_4_ = iStack_e14 + iStack_a64 >> auVar101;
  auVar62._0_4_ = local_e18 + local_a68 >> auVar101;
  auVar62._12_4_ = iStack_e0c + iStack_a5c >> auVar101;
  auVar62._8_4_ = iStack_e10 + iStack_a60 >> auVar101;
  auVar61._4_4_ = iStack_e34 + iStack_a64 >> auVar102;
  auVar61._0_4_ = local_e38 + local_a68 >> auVar102;
  auVar61._12_4_ = iStack_e2c + iStack_a5c >> auVar102;
  auVar61._8_4_ = iStack_e30 + iStack_a60 >> auVar102;
  auVar100 = packssdw(auVar62,auVar61);
  in_RDI[0x30] = auVar100;
  return;
}

Assistant:

static inline void idct64_stage10_sse2(__m128i *x, const int32_t *cospi,
                                       const __m128i __rounding,
                                       int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[31]);
  btf_16_adds_subs_sse2(x[1], x[30]);
  btf_16_adds_subs_sse2(x[2], x[29]);
  btf_16_adds_subs_sse2(x[3], x[28]);
  btf_16_adds_subs_sse2(x[4], x[27]);
  btf_16_adds_subs_sse2(x[5], x[26]);
  btf_16_adds_subs_sse2(x[6], x[25]);
  btf_16_adds_subs_sse2(x[7], x[24]);
  btf_16_adds_subs_sse2(x[8], x[23]);
  btf_16_adds_subs_sse2(x[9], x[22]);
  btf_16_adds_subs_sse2(x[10], x[21]);
  btf_16_adds_subs_sse2(x[11], x[20]);
  btf_16_adds_subs_sse2(x[12], x[19]);
  btf_16_adds_subs_sse2(x[13], x[18]);
  btf_16_adds_subs_sse2(x[14], x[17]);
  btf_16_adds_subs_sse2(x[15], x[16]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[40], x[55], x[40], x[55]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[41], x[54], x[41], x[54]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[42], x[53], x[42], x[53]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[43], x[52], x[43], x[52]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[44], x[51], x[44], x[51]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[45], x[50], x[45], x[50]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[46], x[49], x[46], x[49]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[47], x[48], x[47], x[48]);
}